

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::DataParameter::Clear(DataParameter *this)

{
  uint uVar1;
  LogMessage *pLVar2;
  string *psVar3;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar3 = (this->source_).ptr_;
      if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x5a8f);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_48,
                            "CHECK failed: !source_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_48);
        psVar3 = (this->source_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      psVar3 = (this->mean_file_).ptr_;
      if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x5a93);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_48,
                            "CHECK failed: !mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_48);
        psVar3 = (this->mean_file_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
  }
  if ((uVar1 & 0xfc) != 0) {
    this->batch_size_ = 0;
    this->crop_size_ = 0;
    this->rand_skip_ = 0;
    this->mirror_ = false;
    this->force_encoded_color_ = false;
    *(undefined2 *)&this->field_0x36 = 0;
    this->backend_ = 0;
  }
  if ((uVar1 & 0x300) != 0) {
    this->scale_ = 1.0;
    this->prefetch_ = 4;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void DataParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.DataParameter)
  if (_has_bits_[0 / 32] & 3u) {
    if (has_source()) {
      GOOGLE_DCHECK(!source_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*source_.UnsafeRawStringPointer())->clear();
    }
    if (has_mean_file()) {
      GOOGLE_DCHECK(!mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*mean_file_.UnsafeRawStringPointer())->clear();
    }
  }
  if (_has_bits_[0 / 32] & 252u) {
    ::memset(&batch_size_, 0, reinterpret_cast<char*>(&backend_) -
      reinterpret_cast<char*>(&batch_size_) + sizeof(backend_));
  }
  if (_has_bits_[8 / 32] & 768u) {
    scale_ = 1;
    prefetch_ = 4u;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}